

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O0

int get_tok(char *c_orig,char **c,size_t *bsz,size_t *toksz,int *line)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  bool bVar4;
  char *local_58;
  uint local_48;
  int i;
  int leading_nl;
  char *e;
  int *line_local;
  size_t *toksz_local;
  size_t *bsz_local;
  char **c_local;
  char *c_orig_local;
  
  while( true ) {
    while( true ) {
      bVar4 = false;
      if (*bsz != 0) {
        bVar4 = ws[(int)**c] != 0;
      }
      if (!bVar4) break;
      if (**c == '\n') {
        *line = *line + 1;
      }
      *bsz = *bsz - 1;
      *c = *c + 1;
    }
    if (*bsz == 0) {
      return 0;
    }
    if (**c != '#') break;
    do {
      if (*bsz == 0) {
        return 0;
      }
      *c = *c + 1;
      *bsz = *bsz - 1;
    } while (**c != '\n');
  }
  for (local_48 = 0; local_48 < 0x19; local_48 = local_48 + 1) {
    if ((kw[(int)local_48].len <= *bsz) &&
       (iVar3 = memcmp(*c,kw[(int)local_48].str,kw[(int)local_48].len), iVar3 == 0)) {
      if ((kw[(int)local_48].id != 7) &&
         (((kw[(int)local_48].id != 5 && (kw[(int)local_48].id != 2)) &&
          (kw[(int)local_48].id != 0x18)))) {
        _i = *c;
        while ((_i = _i + -1, c_orig < _i && (*_i != '\n'))) {
          if (ws[(int)*_i] == 0) goto LAB_0010b7ea;
        }
      }
      if (kw[(int)local_48].len < *bsz) {
        local_58 = *c + kw[(int)local_48].len;
      }
      else {
        local_58 = " ";
      }
      if (ws[(int)*local_58] != 0) {
        *toksz = kw[(int)local_48].len;
        return kw[(int)local_48].id;
      }
    }
  }
LAB_0010b7ea:
  if (**c == '\"') {
    *toksz = 1;
    do {
      if (*bsz <= *toksz) {
        return -1;
      }
      pcVar1 = *c;
      sVar2 = *toksz;
      *toksz = *toksz + 1;
      if (pcVar1[sVar2] == '\"') {
        return 0x1b;
      }
    } while (pcVar1[sVar2] != '\n');
    c_orig_local._4_4_ = -1;
  }
  else {
    *toksz = 0;
    while( true ) {
      bVar4 = false;
      if (*toksz < *bsz) {
        bVar4 = ws[(int)(*c)[*toksz]] == 0;
      }
      if (!bVar4) break;
      *toksz = *toksz + 1;
    }
    if (*toksz == 0) {
      c_orig_local._4_4_ = -1;
    }
    else {
      c_orig_local._4_4_ = 3;
    }
  }
  return c_orig_local._4_4_;
}

Assistant:

int get_tok(char *c_orig, char **c, size_t *bsz, size_t *toksz, int *line) {
  char *e;
  int leading_nl=0;

 again:
  /* skip leading whitespace */
  while(*bsz && ws[(int)**c]) {
    if (**c=='\n') { 
      leading_nl=1;
      (*line)++;
    }
    (*bsz)--; (*c)++;
  }
  if (*bsz == 0) return 0; // end of input

  /* disregard comments til end of line */
  if (**c=='#') {
    while (*bsz) {
      (*c)++; (*bsz)--;
      if (**c == '\n') goto again;
    }
    return 0; /* eob while looking for trailing newline */
  }

  /* identify literal keywords */
  int i;
  for(i=0; i < sizeof(kw)/sizeof(*kw); i++) {
    if (*bsz < kw[i].len) continue;
    if (memcmp(*c,kw[i].str,kw[i].len) ) continue;
    /* keywords except "{ on to every" must be preceded by start-of-buf or newline */
    if (kw[i].id != TOK_LCURLY && 
        kw[i].id != TOK_ON     && 
        kw[i].id != TOK_TO     && 
        kw[i].id != TOK_EVERY) {
      for(e=(*c)-1; e > c_orig; e--) {
        if (*e == '\n') break;
        if (ws[(int)*e]) continue;
        /* has non-newline chars preceding, so do not consider as a keyword */
        else goto quoted; 
      }
    }
    /* require keywords to end with space or eob */
    e = (*bsz > kw[i].len) ? (*c + kw[i].len) : " ";
    if (!ws[(int)(*e)]) continue;
    *toksz = kw[i].len;
    return kw[i].id;
  }

 quoted:
  /* identify quoted string that ends with the closing quote on same line */
  if (**c=='"') {
    *toksz=1;
    while (*toksz < *bsz) {
      e = *c + *toksz;
      (*toksz)++;
      if (*e == '"') return TOK_QUOTEDSTR;
      if (*e == '\n') return -1;
    }
    return -1; /* eob without terminating quote */
  }

  /* otherwise its a string ending with end-of-buffer or whitespace */
  *toksz=0; 
  while ((*toksz < *bsz) && (!ws[(int)*(*c+*toksz)])) (*toksz)++;
  if (*toksz) return TOK_STR; 

  return -1;
}